

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# largebuddyrange.h
# Opt level: O0

Handle snmalloc::
       BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
       ::ref(bool direction,Contents k)

{
  byte bVar1;
  address_t in_RSI;
  byte in_DIL;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry;
  Word w;
  undefined7 in_stack_ffffffffffffffd8;
  BackendStateWordRef local_20 [4];
  
  bVar1 = in_DIL & 1;
  if (in_RSI == 0) {
    MetaEntryBase::BackendStateWordRef::BackendStateWordRef(local_20,&ref::null_entry);
  }
  else {
    FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
    ::get_mut<false>(&BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                      ::concretePagemap,in_RSI);
    w = (Word)(in_RSI >> 0x20);
    if ((bVar1 & 1) == 0) {
      local_20[0] = MetaEntryBase::get_backend_word
                              ((MetaEntryBase *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),w);
    }
    else {
      local_20[0] = MetaEntryBase::get_backend_word
                              ((MetaEntryBase *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),w);
    }
  }
  return (Handle)local_20[0].val;
}

Assistant:

static Handle ref(bool direction, Contents k)
    {
      // Special case for accessing the null entry.  We want to make sure
      // that this is never modified by the back end, so we make it point to
      // a constant entry and use the MMU to trap even in release modes.
      static const Contents null_entry = 0;
      if (SNMALLOC_UNLIKELY(address_cast(k) == 0))
      {
        return {const_cast<Contents*>(&null_entry)};
      }
      auto& entry = Pagemap::template get_metaentry_mut<false>(address_cast(k));
      if (direction)
        return entry.get_backend_word(Pagemap::Entry::Word::One);

      return entry.get_backend_word(Pagemap::Entry::Word::Two);
    }